

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void __thiscall
so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
stored<so_5::mchain_props::details::limited_dynamic_demand_queue>
          (deliver_op_tracer *this,limited_dynamic_demand_queue *queue)

{
  chain_size local_20;
  limited_dynamic_demand_queue *local_18;
  limited_dynamic_demand_queue *queue_local;
  deliver_op_tracer *this_local;
  
  local_18 = queue;
  queue_local = (limited_dynamic_demand_queue *)this;
  local_20.m_size = mchain_props::details::limited_dynamic_demand_queue::size(queue);
  make_trace<so_5::impl::msg_tracing_helpers::details::chain_size>(this,"stored",&local_20);
  return;
}

Assistant:

void
				stored( const QUEUE & queue )
					{
						make_trace( "stored", details::chain_size{ queue.size() } );
					}